

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

bool __thiscall jrtplib::RTCPSDESPacket::GotoNextItem(RTCPSDESPacket *this)

{
  size_t sVar1;
  size_t offset;
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->currentchunk[this->itemoffset] == '\0') {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = (ulong)(this->currentchunk + this->itemoffset)[1] + this->itemoffset + 2;
    if (this->currentchunk[sVar1] == '\0') {
      this_local._7_1_ = false;
    }
    else {
      this->itemoffset = sVar1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool RTCPSDESPacket::GotoNextItem()
{
	if (!knownformat)
		return false;
	if (currentchunk == 0)
		return false;
	
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return false;
	
	size_t offset = itemoffset;
	offset += sizeof(RTCPSDESHeader);
	offset += (size_t)(sdeshdr->length);
	sdeshdr = (RTCPSDESHeader *)(currentchunk+offset);
	if (sdeshdr->sdesid == 0)
		return false;
	itemoffset = offset;
	return true;
}